

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O3

void __thiscall
QPDFLogger::setOutputStreams(QPDFLogger *this,ostream *out_stream,ostream *err_stream)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<Pipeline> *psVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  basic_ostream<char,_std::char_traits<char>_> *__args_1;
  undefined1 local_49;
  Pl_OStream *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  Pl_OStream *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  Pl_OStream *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  __args_1 = (basic_ostream<char,_std::char_traits<char>_> *)0x0;
  if (err_stream != (ostream *)&std::cerr) {
    __args_1 = err_stream;
  }
  local_38 = (Pl_OStream *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = (Pl_OStream *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (out_stream == (ostream *)&std::cout || out_stream == (ostream *)0x0) {
    peVar1 = (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38 = (Pl_OStream *)
               (peVar1->p_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((Pl_OStream *)
        (peVar1->p_save).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr == local_38
       ) {
      local_38 = (Pl_OStream *)
                 (peVar1->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      psVar2 = &peVar1->p_stderr;
    }
    else {
      psVar2 = &peVar1->p_stdout;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_30,
               &(psVar2->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  }
  else {
    local_48 = (Pl_OStream *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_OStream,std::allocator<Pl_OStream>,char_const(&)[7],std::ostream&>
              (&_Stack_40,&local_48,(allocator<Pl_OStream> *)&local_49,(char (*) [7])0x26c97a,
               out_stream);
    _Var3._M_pi = _Stack_30._M_pi;
    _Stack_30._M_pi = _Stack_40._M_pi;
    local_38 = local_48;
    local_48 = (Pl_OStream *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
      }
    }
  }
  if (__args_1 == (basic_ostream<char,_std::char_traits<char>_> *)0x0) {
    peVar1 = (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28 = (Pl_OStream *)
               (peVar1->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (a_Stack_20,
               &(peVar1->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    local_48 = (Pl_OStream *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_OStream,std::allocator<Pl_OStream>,char_const(&)[13],std::ostream&>
              (&_Stack_40,&local_48,(allocator<Pl_OStream> *)&local_49,(char (*) [13])"error output"
               ,__args_1);
    _Var3._M_pi = a_Stack_20[0]._M_pi;
    a_Stack_20[0]._M_pi = _Stack_40._M_pi;
    local_28 = local_48;
    local_48 = (Pl_OStream *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
      }
    }
  }
  peVar1 = (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar1->p_info).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_Pipeline;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar1->p_info).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &_Stack_30);
  peVar1 = (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar1->p_warn).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this_00 = (peVar1->p_warn).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (peVar1->p_warn).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  peVar1 = (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar1->p_error).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_28->super_Pipeline;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar1->p_error).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,a_Stack_20);
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

void
QPDFLogger::setOutputStreams(std::ostream* out_stream, std::ostream* err_stream)
{
    if (out_stream == &std::cout) {
        out_stream = nullptr;
    }
    if (err_stream == &std::cerr) {
        err_stream = nullptr;
    }
    std::shared_ptr<Pipeline> new_out;
    std::shared_ptr<Pipeline> new_err;

    if (out_stream == nullptr) {
        if (m->p_save == m->p_stdout) {
            new_out = m->p_stderr;
        } else {
            new_out = m->p_stdout;
        }
    } else {
        new_out = std::make_shared<Pl_OStream>("output", *out_stream);
    }
    if (err_stream == nullptr) {
        new_err = m->p_stderr;
    } else {
        new_err = std::make_shared<Pl_OStream>("error output", *err_stream);
    }
    m->p_info = new_out;
    m->p_warn = nullptr;
    m->p_error = new_err;
}